

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::Values
          (Connection *this,string *values,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_names,string *alias)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  shared_ptr<duckdb::Relation,_true> sVar2;
  shared_ptr<duckdb::ValueRelation,_true> local_38;
  shared_ptr<duckdb::ValueRelation> local_20;
  
  local_20.super___shared_ptr<duckdb::ValueRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ValueRelation,std::allocator<duckdb::ValueRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>&,std::__cxx11::string_const&,duckdb::vector<std::__cxx11::string,true>const&,std::__cxx11::string_const&>
            (&local_20.super___shared_ptr<duckdb::ValueRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ValueRelation **)&local_20,(allocator<duckdb::ValueRelation> *)&local_38,
             (shared_ptr<duckdb::ClientContext,_true> *)values,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)column_names,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)alias,in_R8);
  shared_ptr<duckdb::ValueRelation,_true>::shared_ptr(&local_38,&local_20);
  _Var1._M_pi = extraout_RDX;
  if (local_20.super___shared_ptr<duckdb::ValueRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<duckdb::ValueRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_38.internal.super___shared_ptr<duckdb::ValueRelation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_38.internal.super___shared_ptr<duckdb::ValueRelation,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Connection::Values(const string &values, const vector<string> &column_names, const string &alias) {
	return make_shared_ptr<ValueRelation>(context, values, column_names, alias);
}